

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy>::
initialize_parameters
          (jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy> *this,
          int32_t t1,int32_t t2,int32_t t3,int32_t reset_threshold)

{
  this->t1_ = t1;
  this->t2_ = t2;
  this->t3_ = t3;
  this->reset_threshold_ = (uint8_t)reset_threshold;
  initialize_quantization_lut(this);
  reset_parameters(this);
  return;
}

Assistant:

void initialize_parameters(const int32_t t1, const int32_t t2, const int32_t t3, const int32_t reset_threshold)
    {
        t1_ = t1;
        t2_ = t2;
        t3_ = t3;
        reset_threshold_ = static_cast<uint8_t>(reset_threshold);

        initialize_quantization_lut();
        reset_parameters();
    }